

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O2

float * __thiscall SparseArray<float,_512UL>::find(SparseArray<float,_512UL> *this,HaU32 key)

{
  HaU32 HVar1;
  HashEntry *pHVar2;
  
  HVar1 = getHash(this,key);
  pHVar2 = (HashEntry *)(this->mHashTable + HVar1);
  do {
    pHVar2 = pHVar2->mNext;
    if (pHVar2 == (HashEntry *)0x0) {
      return (float *)0x0;
    }
  } while (pHVar2->mKey != key);
  return &pHVar2->mValue;
}

Assistant:

Value* find(HaU32 key)  const
	{
		Value* ret = NULL;
		HaU32 hash = getHash(key);
		HashEntry* h = mHashTable[hash];
		while (h)
		{
			if (h->mKey == key)
			{
				ret = &h->mValue;
				break;
			}
			h = h->mNext;
		}
		return ret;
	}